

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O1

uint __thiscall llvm::APInt::countLeadingZerosSlowCase(APInt *this)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar1 = this->BitWidth;
  uVar5 = (ulong)uVar1 + 0x3f >> 6;
  iVar4 = 0;
  do {
    if ((long)uVar5 < 1) break;
    uVar2 = *(ulong *)(((this->U).VAL - 8) + uVar5 * 8);
    if (uVar2 == 0) {
      uVar6 = 0x40;
    }
    else {
      lVar3 = 0x3f;
      if (uVar2 != 0) {
        for (; uVar2 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      uVar6 = (uint)lVar3 ^ 0x3f;
    }
    uVar5 = uVar5 - 1;
    iVar4 = iVar4 + uVar6;
  } while (uVar2 == 0);
  uVar6 = uVar1 | 0xffffffc0;
  if ((uVar1 & 0x3f) == 0) {
    uVar6 = 0;
  }
  return uVar6 + iVar4;
}

Assistant:

unsigned getNumWords() const { return getNumWords(BitWidth); }